

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O3

string * anon_unknown.dwarf_184e74::randomWord
                   (string *__return_storage_ptr__,bool alphaNumeric,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *options)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  string *extraout_RAX;
  string *psVar5;
  undefined4 extraout_var;
  pointer pcVar6;
  string *word;
  ulong uVar7;
  
  uVar7 = (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    uVar3 = random_int(0x20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (string *)std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar3)
    ;
    if (0 < (int)uVar3) {
      uVar7 = 0;
      do {
        if (alphaNumeric) {
          uVar4 = random_int(0x3e);
          pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if ((int)uVar4 < 0x1a) {
            psVar5 = (string *)(ulong)(uVar4 + 0x41);
          }
          else if (uVar4 < 0x34) {
            psVar5 = (string *)(ulong)(uVar4 + 0x47);
          }
          else {
            psVar5 = (string *)(ulong)(uVar4 - 4);
          }
        }
        else {
          iVar2 = random_int(0x100);
          psVar5 = (string *)CONCAT44(extraout_var,iVar2);
          pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
        }
        pcVar6[uVar7] = (char)psVar5;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    return psVar5;
  }
  iVar2 = random_int((int)(uVar7 >> 5));
  pbVar1 = (options->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = pbVar1[iVar2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar6,pcVar6 + pbVar1[iVar2]._M_string_length);
  return extraout_RAX;
}

Assistant:

std::string
randomWord (bool alphaNumeric, const std::vector<std::string>& options)
{
    if (options.size () > 0) { return options[random_int (options.size ())]; }
    else
    {
        int         length = random_int (32);
        std::string word (length, ' ');
        for (int l = 0; l < length; ++l)
        {
            if (alphaNumeric)
            {
                int index =
                    random_int (62); // 26 letters*2 for case + 10 digits
                if (index < 26) { word[l] = 'A' + index; }
                else if (index < 52)
                {
                    word[l] = 'a' + (index - 26);
                }
                else
                {
                    word[l] = '0' + (index - 52);
                }
            }
            else
            {
                word[l] = random_int (256);
            }
        }
        return word;
    }
}